

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::insertItems(Picker *this,int index,QStringList *texts)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint *puVar7;
  PickerPrivate *pPVar8;
  Promoted<int,_long_long> PVar9;
  QStandardItem *this_00;
  const_reference pQVar10;
  ulong uVar11;
  QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
  *this_01;
  QModelIndex local_138;
  int local_11c;
  int mc;
  QVariant local_100;
  QModelIndex local_e0;
  undefined1 local_c8 [16];
  quintptr local_b8;
  int local_ac;
  undefined1 auStack_a8 [4];
  int i_1;
  QModelIndex item;
  QModelIndex local_88;
  int local_70;
  int i;
  undefined8 local_60;
  QStandardItem *hiddenRoot;
  QList<QStandardItem_*> items;
  QStandardItemModel *m;
  int local_30;
  int local_2c;
  int local_28;
  int insertCount;
  QStringList *local_20;
  QStringList *texts_local;
  Picker *pPStack_10;
  int index_local;
  Picker *this_local;
  
  local_20 = texts;
  texts_local._4_4_ = index;
  pPStack_10 = this;
  bVar4 = QList<QString>::isEmpty(texts);
  if (!bVar4) {
    insertCount = 0;
    local_28 = count(this);
    puVar7 = (uint *)qBound<int>(&insertCount,(int *)((long)&texts_local + 4),&local_28);
    texts_local._4_4_ = *puVar7;
    pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    local_30 = pPVar8->maxCount - texts_local._4_4_;
    m = (QStandardItemModel *)QList<QString>::count(local_20);
    PVar9 = qMin<int,long_long>(&local_30,(longlong *)&m);
    local_2c = (int)PVar9;
    if (0 < local_2c) {
      pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      items.d.size = (qsizetype)qobject_cast<QStandardItemModel*>((QObject *)pPVar8->model);
      if ((QStandardItemModel *)items.d.size == (QStandardItemModel *)0x0) {
        pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        pPVar8->inserting = true;
        pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        uVar3 = texts_local._4_4_;
        iVar6 = local_2c;
        pQVar1 = pPVar8->model;
        pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&pPVar8->root);
        uVar11 = (**(code **)(*(long *)pQVar1 + 0xf8))(pQVar1,uVar3,iVar6,&local_88);
        if ((uVar11 & 1) == 0) {
          pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                   ::operator->(&this->d);
          pPVar8->inserting = false;
        }
        else {
          QModelIndex::QModelIndex((QModelIndex *)auStack_a8);
          for (local_ac = 0; local_ac < local_2c; local_ac = local_ac + 1) {
            this_01 = &this->d;
            pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                     ::operator->(this_01);
            pQVar1 = pPVar8->model;
            iVar5 = local_ac + texts_local._4_4_;
            pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                     ::operator->(this_01);
            iVar6 = pPVar8->modelColumn;
            pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                     ::operator->(this_01);
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_e0,&pPVar8->root);
            (**(code **)(*(long *)pQVar1 + 0x60))(local_c8,pQVar1,iVar5,iVar6,&local_e0);
            item.i = local_b8;
            auStack_a8 = (undefined1  [4])local_c8._0_4_;
            i_1 = local_c8._4_4_;
            item.r = local_c8._8_4_;
            item.c = local_c8._12_4_;
            pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                     ::operator->(this_01);
            pQVar1 = pPVar8->model;
            pQVar10 = QList<QString>::at(local_20,(long)local_ac);
            QVariant::QVariant(&local_100,(QString *)pQVar10);
            (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,auStack_a8,&local_100,0);
            QVariant::~QVariant(&local_100);
          }
          pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                   ::operator->(&this->d);
          pPVar8->inserting = false;
          pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                   ::operator->(&this->d);
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)&stack0xfffffffffffffee8,&pPVar8->root);
          _q_rowsInserted(this,(QModelIndex *)&stack0xfffffffffffffee8,texts_local._4_4_,
                          texts_local._4_4_ + local_2c + -1);
        }
      }
      else {
        QList<QStandardItem_*>::QList((QList<QStandardItem_*> *)&hiddenRoot);
        local_60 = QStandardItemModel::invisibleRootItem();
        for (local_70 = 0; local_70 < local_2c; local_70 = local_70 + 1) {
          this_00 = (QStandardItem *)operator_new(0x10);
          pQVar10 = QList<QString>::at(local_20,(long)local_70);
          QStandardItem::QStandardItem(this_00,(QString *)pQVar10);
          QList<QStandardItem_*>::append((QList<QStandardItem_*> *)&hiddenRoot,this_00);
        }
        QStandardItem::insertRows((int)local_60,(QList_conflict *)(ulong)texts_local._4_4_);
        QList<QStandardItem_*>::~QList((QList<QStandardItem_*> *)&hiddenRoot);
      }
      iVar6 = count(this);
      local_11c = iVar6;
      pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      if (pPVar8->maxCount < iVar6) {
        pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        pQVar1 = pPVar8->model;
        pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        iVar2 = local_11c;
        iVar6 = pPVar8->maxCount;
        pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        iVar5 = pPVar8->maxCount;
        pPVar8 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
                 ::operator->(&this->d);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_138,&pPVar8->root);
        (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,iVar6,iVar2 - iVar5,&local_138);
      }
    }
  }
  return;
}

Assistant:

void
Picker::insertItems( int index, const QStringList & texts )
{
	if( texts.isEmpty() )
		return;

	index = qBound( 0, index, count() );

	int insertCount = qMin( d->maxCount - index, texts.count() );

	if( insertCount <= 0 )
		return;

	// For the common case where we are using the built in QStandardItemModel
	// construct a QStandardItem, reducing the number of expensive signals from
	// the model
	if( QStandardItemModel * m = qobject_cast< QStandardItemModel* > ( d->model ) )
	{
		QList< QStandardItem* > items;

		QStandardItem * hiddenRoot = m->invisibleRootItem();

		for( int i = 0; i < insertCount; ++i )
			items.append( new QStandardItem( texts.at( i ) ) );

		hiddenRoot->insertRows( index, items );
	}
	else
	{
		d->inserting = true;

		if( d->model->insertRows( index, insertCount, d->root ) )
		{
			QModelIndex item;

			for( int i = 0; i < insertCount; ++i )
			{
				item = d->model->index( i + index, d->modelColumn, d->root );
				d->model->setData( item, texts.at( i ), Qt::DisplayRole );
			}

			d->inserting = false;

			_q_rowsInserted( d->root, index, index + insertCount - 1 );

		}
		else
			d->inserting = false;
	}

	int mc = count();

	if( mc > d->maxCount )
		d->model->removeRows( d->maxCount, mc - d->maxCount, d->root );
}